

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Line.cpp
# Opt level: O0

void __thiscall Line::generate_options(Line *this,Known *known)

{
  int iVar1;
  initializer_list<std::vector<bool,_std::allocator<bool>_>_> __l;
  bool bVar2;
  const_reference cVar3;
  int iVar4;
  size_type sVar5;
  reference pvVar6;
  reference pvVar7;
  difference_type dVar8;
  const_iterator cVar9;
  vector<bool,_std::allocator<bool>_> *local_1a8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_198;
  int *local_190;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_188;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_180;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> t;
  int local_170;
  int lower_limit;
  undefined1 local_168 [4];
  int failed_required;
  vector<bool,_std::allocator<bool>_> option;
  int iStack_138;
  bool advanced;
  int generated;
  int required_filler;
  int index;
  undefined1 local_128 [8];
  vector<int,_std::allocator<int>_> iterators;
  undefined1 local_108 [4];
  int i;
  vector<int,_std::allocator<int>_> required;
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  *extended_possible_per_place;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *possible_per_number;
  pair<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  generated_possibilities;
  vector<bool,_std::allocator<bool>_> local_98;
  undefined1 local_70 [32];
  uint local_50;
  _Bit_type *local_48;
  uint local_40;
  _Bit_type *local_38;
  uint local_30;
  _Bit_type *local_28;
  uint local_20;
  Known *local_18;
  Known *known_local;
  Line *this_local;
  
  local_18 = known;
  known_local = (Known *)this;
  cVar9 = std::vector<bool,_std::allocator<bool>_>::begin(&known->first);
  local_38 = cVar9.super__Bit_iterator_base._M_p;
  local_30 = cVar9.super__Bit_iterator_base._M_offset;
  local_28 = local_38;
  local_20 = local_30;
  cVar9 = std::vector<bool,_std::allocator<bool>_>::end(&local_18->first);
  local_70._24_8_ = cVar9.super__Bit_iterator_base._M_p;
  local_50 = cVar9.super__Bit_iterator_base._M_offset;
  local_48 = (_Bit_type *)local_70._24_8_;
  local_40 = local_50;
  bVar2 = std::
          all_of<std::_Bit_const_iterator,Line::generate_options(std::pair<std::vector<bool,std::allocator<bool>>,std::vector<bool,std::allocator<bool>>>const&)::__0>
                    (local_28,local_20,local_70._24_8_,local_50);
  if (bVar2) {
    std::vector<bool,_std::allocator<bool>_>::vector(&local_98,&local_18->second);
    local_70._0_8_ = &local_98;
    local_70._8_8_ = 1;
    __l._M_len = 1;
    __l._M_array = (iterator)local_70._0_8_;
    std::
    vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    ::operator=(&this->m_options,__l);
    local_1a8 = (vector<bool,_std::allocator<bool>_> *)local_70;
    do {
      local_1a8 = local_1a8 + -1;
      std::vector<bool,_std::allocator<bool>_>::~vector(local_1a8);
    } while (local_1a8 != &local_98);
  }
  else {
    generate_possible_per_number
              ((pair<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                *)&possible_per_number,this,local_18);
    required.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)&generated_possibilities.first.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_108);
    for (iterators.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_ = 0;
        iterators.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ < this->m_size;
        iterators.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ =
             iterators.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage._4_4_ + 1) {
      cVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        (&local_18->first,
                         (long)(int)iterators.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage._4_4_);
      if ((cVar3) &&
         (cVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            (&local_18->second,
                             (long)(int)iterators.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_),
         cVar3)) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)local_108,
                   (value_type_conflict2 *)
                   ((long)&iterators.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 4));
      }
    }
    sVar5 = std::vector<int,_std::allocator<int>_>::size(&this->m_numbers);
    index = 0;
    std::allocator<int>::allocator((allocator<int> *)((long)&required_filler + 3));
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_128,sVar5,&index,
               (allocator<int> *)((long)&required_filler + 3));
    std::allocator<int>::~allocator((allocator<int> *)((long)&required_filler + 3));
    option.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage._4_4_ = 0;
    do {
      option.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage._3_1_ = 0;
      generate_option((vector<bool,_std::allocator<bool>_> *)local_168,this,
                      (vector<int,_std::allocator<int>_> *)local_128,
                      (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       *)&possible_per_number);
      option.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage._4_4_ =
           option.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_end_of_storage._4_4_ + 1;
      iVar4 = check_option_by_required
                        ((vector<int,_std::allocator<int>_> *)local_108,
                         (vector<bool,_std::allocator<bool>_> *)local_168);
      if (iVar4 == -1) {
        std::
        vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
        ::push_back(&this->m_options,(value_type *)local_168);
LAB_001082bb:
        if ((option.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_end_of_storage._3_1_ & 1) == 0) {
          sVar5 = std::vector<int,_std::allocator<int>_>::size(&this->m_numbers);
          generated = (int)sVar5;
          do {
            iVar4 = generated;
            generated = iVar4 + -1;
            bVar2 = false;
            if (-1 < generated) {
              pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)local_128,(long)generated);
              iVar1 = *pvVar6;
              pvVar7 = std::
                       vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     *)&possible_per_number,(long)generated);
              sVar5 = std::vector<int,_std::allocator<int>_>::size(pvVar7);
              bVar2 = (long)iVar1 == sVar5 - 1;
            }
          } while (bVar2);
          if (generated < 0) {
            local_170 = 6;
            goto LAB_00108540;
          }
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_128,(long)generated);
          *pvVar6 = *pvVar6 + 1;
          generated = iVar4;
        }
        for (; sVar5 = std::vector<int,_std::allocator<int>_>::size(&this->m_numbers),
            (ulong)(long)generated < sVar5; generated = generated + 1) {
          pvVar7 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 *)&possible_per_number,(long)(generated + -1));
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_128,(long)(generated + -1))
          ;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,(long)*pvVar6);
          iVar4 = *pvVar6;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&this->m_numbers,(long)(generated + -1));
          t._M_current._4_4_ = iVar4 + 1 + *pvVar6;
          pvVar7 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 *)&possible_per_number,(long)generated);
          local_188._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(pvVar7);
          pvVar7 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 *)&possible_per_number,(long)generated);
          local_190 = (int *)std::vector<int,_std::allocator<int>_>::end(pvVar7);
          local_180 = std::
                      lower_bound<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                                (local_188,
                                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                                 local_190,(int *)((long)&t._M_current + 4));
          pvVar7 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 *)&possible_per_number,(long)generated);
          local_198._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(pvVar7);
          dVar8 = __gnu_cxx::operator-(&local_180,&local_198);
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_128,(long)generated);
          *pvVar6 = (value_type)dVar8;
        }
        local_170 = 0;
      }
      else {
        sVar5 = std::vector<int,_std::allocator<int>_>::size(&this->m_numbers);
        iStack_138 = (int)sVar5;
        do {
          iVar1 = iStack_138;
          iStack_138 = iVar1 + -1;
          bVar2 = false;
          if (-1 < iStack_138) {
            pvVar7 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   *)&possible_per_number,(long)iStack_138);
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)local_128,(long)iStack_138);
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,(long)*pvVar6);
            bVar2 = iVar4 < *pvVar6;
          }
        } while (bVar2);
        if (-1 < iStack_138) {
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_128,(long)iStack_138);
          iVar4 = *pvVar6;
          pvVar7 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 *)&possible_per_number,(long)iStack_138);
          sVar5 = std::vector<int,_std::allocator<int>_>::size(pvVar7);
          if ((long)iVar4 != sVar5 - 1) {
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)local_128,(long)iStack_138);
            *pvVar6 = *pvVar6 + 1;
            option.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_end_of_storage._3_1_ = 1;
            generated = iVar1;
          }
          goto LAB_001082bb;
        }
        local_170 = 6;
      }
LAB_00108540:
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)local_168);
    } while (local_170 == 0);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_128);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_108);
    std::
    pair<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
    ::~pair((pair<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
             *)&possible_per_number);
  }
  return;
}

Assistant:

void Line::generate_options(const Known &known) {
#if DEBUG_LOGS
    Logger(DEBUG).get() << "Originally possible " << get_combinations_number() << " options" << endl;
#endif // DEBUG_LOGS

    if (all_of(known.first.begin(), known.first.end(), [](bool v) { return v; })) {
        m_options = {known.second};

#if DEBUG_LOGS
        Logger(DEBUG).get() << "All known" << endl;
#endif // DEBUG_LOGS

        return;
    }

    auto generated_possibilities = generate_possible_per_number(known);
    vector<vector<int>> &possible_per_number = generated_possibilities.first;
    vector<set<int>> &extended_possible_per_place = generated_possibilities.second;

    // Get known black.
    vector<int> required;
    for (int i = 0; i < m_size; i++) {
        if (known.first[i] && known.second[i]) {
            required.push_back(i);
        }
    }

    vector<int> iterators(m_numbers.size(), 0);
    int index;
    int required_filler;
    int generated = 0;

    // Generate all options for the line.
    while (true) {
        bool advanced = false;
        auto option = generate_option(iterators, possible_per_number);
        generated++;

        int failed_required = check_option_by_required(required, option);
        if (failed_required == -1) {
            m_options.push_back(move(option));
        } else {
            for (required_filler = m_numbers.size() - 1;
                 (required_filler >= 0) && (possible_per_number[required_filler][iterators[required_filler]] >
                                            failed_required); required_filler--);
            if (required_filler < 0) break;
            if (iterators[required_filler] != possible_per_number[required_filler].size() - 1) {
                iterators[required_filler]++;
                advanced = true;
                index = required_filler + 1;
            }
        }

        if (!advanced) {
            for (index = (int) m_numbers.size() - 1;
                 (index >= 0) && (iterators[index] == possible_per_number[index].size() - 1); index--);
            if (index < 0) break;

            iterators[index]++;
            index++;
        }

        for (; index < m_numbers.size(); index++) {
            int lower_limit = possible_per_number[index - 1][iterators[index - 1]] + m_numbers[index - 1] + 1;
            auto t = lower_bound(possible_per_number[index].begin(), possible_per_number[index].end(), lower_limit);
            iterators[index] = t - possible_per_number[index].begin();
        }
    }

#if DEBUG_LOGS
    Logger(DEBUG).get() << "Generated " << m_options.size() << " options (saved "
                        << get_combinations_number() - generated << " by optimization and "
                        << generated - m_options.size() << " by filtering)" << endl;
#endif // DEBUG_LOGS
}